

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O1

void gimage::createGaussPyramid<float,float>
               (vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                *p,Image<float,_gimage::PixelTraits<float>_> *image)

{
  Image<float,_gimage::PixelTraits<float>_> *this;
  pointer pIVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  double dVar5;
  
  lVar4 = image->width;
  if (image->height < image->width) {
    lVar4 = image->height;
  }
  uVar3 = 0;
  if (1 < (int)lVar4) {
    dVar5 = log((double)(int)lVar4);
    dVar5 = floor(dVar5 / 0.6931471805599453);
    uVar3 = (uint)dVar5;
  }
  std::
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  ::resize(p,(long)(int)uVar3);
  if (uVar3 != 0) {
    this = (p->
           super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    if (this != image) {
      Image<float,_gimage::PixelTraits<float>_>::setSize
                (this,image->width,image->height,(long)image->depth);
      lVar4 = this->n;
      lVar2 = -lVar4;
      if (0 < lVar4) {
        lVar2 = lVar4;
      }
      memcpy(this->pixel,**image->img,lVar2 << 2);
    }
    if (1 < (int)uVar3) {
      lVar4 = 0x38;
      do {
        pIVar1 = (p->
                 super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        reduceGauss<float,float>
                  ((Image<float,_gimage::PixelTraits<float>_> *)((long)&pIVar1->depth + lVar4),
                   (Image<float,_gimage::PixelTraits<float>_> *)((long)&pIVar1[-1].depth + lVar4));
        lVar4 = lVar4 + 0x38;
      } while ((ulong)uVar3 * 0x38 - lVar4 != 0);
    }
  }
  return;
}

Assistant:

void createGaussPyramid(std::vector<Image<T> > &p, const Image<S> &image)
{
  // determine number of levels

  int n=std::min(image.getWidth(), image.getHeight());

  if (n >= 2)
  {
    n=static_cast<int>(std::floor(std::log(n)/std::log(2)));
  }
  else
  {
    n=0;
  }

  p.resize(n);

  if (n == 0) return; // input image is too small

  // populate highest level with given image if not already done

  if (&(p[0]) != &image)
  {
    p[0].setImage(image);
  }

  // smooth and downsample image for all other levels

  for (int i=1; i<n; i++)
  {
    reduceGauss(p[i], p[i-1]);
  }
}